

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O0

void __thiscall
Assimp::MemoryIOStream::MemoryIOStream(MemoryIOStream *this,uint8_t *buff,size_t len,bool own)

{
  bool own_local;
  size_t len_local;
  uint8_t *buff_local;
  MemoryIOStream *this_local;
  
  IOStream::IOStream(&this->super_IOStream);
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00f3cd70;
  this->buffer = buff;
  this->length = len;
  this->pos = 0;
  this->own = own;
  return;
}

Assistant:

MemoryIOStream (const uint8_t* buff, size_t len, bool own = false)
    : buffer (buff)
    , length(len)
    , pos((size_t)0)
    , own(own) {
        // empty
    }